

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

QMultiMap<QByteArray,_int> __thiscall Generator::automaticPropertyMetaTypesHelper(Generator *this)

{
  PropertyDef *pPVar1;
  bool bVar2;
  int iVar3;
  QByteArray *propertyType;
  Generator *in_RSI;
  long in_FS_OFFSET;
  QStringBuilder<const_char_*,_const_QByteArray_&> local_68;
  QArrayDataPointer<char> local_58;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->parser = (Moc *)0x0;
  iVar3 = 0;
  while( true ) {
    local_3c = iVar3;
    if ((int)(in_RSI->cdef->propertyList).d.size <= iVar3) break;
    pPVar1 = (in_RSI->cdef->propertyList).d.ptr;
    propertyType = &pPVar1[iVar3].type;
    bVar2 = registerableMetaType(in_RSI,propertyType);
    if (bVar2) {
      bVar2 = isBuiltinType(propertyType);
      if (!bVar2) {
        local_68.a = cxxTypeTag((TypeTags)
                                pPVar1[iVar3].typeTag.super_QFlagsStorageHelper<TypeTag,_4>.
                                super_QFlagsStorage<TypeTag>.i);
        local_68.b = propertyType;
        QStringBuilder<const_char_*,_const_QByteArray_&>::convertTo<QByteArray>
                  ((QByteArray *)&local_58,&local_68);
        QMultiMap<QByteArray,_int>::insert
                  ((QMultiMap<QByteArray,_int> *)this,(QByteArray *)&local_58,&local_3c);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
      }
    }
    iVar3 = local_3c + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>_>
            )(QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>_>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

QMultiMap<QByteArray, int> Generator::automaticPropertyMetaTypesHelper()
{
    QMultiMap<QByteArray, int> automaticPropertyMetaTypes;
    for (int i = 0; i < int(cdef->propertyList.size()); ++i) {
        const PropertyDef &p = cdef->propertyList.at(i);
        const QByteArray &propertyType = p.type;
        if (registerableMetaType(propertyType) && !isBuiltinType(propertyType))
            automaticPropertyMetaTypes.insert(cxxTypeTag(p.typeTag) + propertyType, i);
    }
    return automaticPropertyMetaTypes;
}